

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Client.h
# Opt level: O1

void __thiscall Jupiter::IRC::Client::Channel::~Channel(Channel *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Jupiter::IRC::Client::Channel::User>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Jupiter::IRC::Client::Channel::User>_>_>,_std::__detail::_Select1st,_jessilib::text_equali,_jessilib::text_hashi,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->m_users)._M_h);
  pcVar1 = (this->m_name)._M_dataplus._M_p;
  paVar2 = &(this->m_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

class JUPITER_API Channel
			{
				friend class Jupiter::IRC::Client;
			public:

				/**
				* @brief Stores data about users.
				*/
				class JUPITER_API User
				{
					friend class Jupiter::IRC::Client::Channel;
				public:

					/**
					* @brief Returns the local user's global user object.
					*
					* @return Local user's global user object.
					*/
					Jupiter::IRC::Client::User *getUser() const;

					/**
					* @brief Returns the user's string of channel prefixes.
					*
					* @return String containing the user's channel prefixes.
					*/
					const std::string& getPrefixes() const;

					/**
					* @brief Fetches the user's nickname.
					*
					* @return String containing the user's nickname.
					*/
					const std::string& getNickname() const;

					/**
					* @brief Fetches the user's username.
					*
					* @return String containing the user's username.
					*/
					const std::string& getUsername() const;

					/**
					* @brief Fetches the user's hostname.
					*
					* @return String containing the user's hostname.
					*/
					const std::string& getHostname() const;

					/**
					* @brief Returns the number of channels the user shares with the local client.
					*
					* @return Number of channels.
					*/
					size_t getChannelCount() const;

					~User();

				/** Private members */
				private:
					std::shared_ptr<Jupiter::IRC::Client::User> m_user;
					std::string m_prefixes;
				}